

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O2

void aom_extend_frame_borders_c(YV12_BUFFER_CONFIG *ybf,int num_planes)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int plane;
  ulong uVar12;
  bool bVar13;
  
  iVar3 = ybf->border;
  bVar1 = (byte)ybf->subsampling_x;
  bVar2 = (byte)ybf->subsampling_y;
  uVar12 = 0;
  uVar8 = (ulong)(uint)num_planes;
  if (num_planes < 1) {
    uVar8 = uVar12;
  }
  if ((ybf->flags & 8) == 0) {
    for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
      bVar13 = uVar12 != 0;
      uVar9 = (ulong)bVar13;
      bVar7 = 0;
      if (bVar13) {
        bVar7 = bVar2;
      }
      bVar6 = 0;
      if (bVar13) {
        bVar6 = bVar1;
      }
      iVar10 = iVar3 >> (bVar7 & 0x1f);
      iVar11 = iVar3 >> (bVar6 & 0x1f);
      iVar4 = *(int *)((long)ybf->store_buf_adr + uVar9 * 4 + -0x38);
      iVar5 = *(int *)((long)ybf->store_buf_adr + uVar9 * 4 + -0x30);
      extend_plane(ybf->store_buf_adr[uVar12 - 4],
                   *(int *)((long)ybf->store_buf_adr + uVar9 * 4 + -0x28),iVar4,iVar5,iVar10,iVar11,
                   (*(int *)((long)ybf->store_buf_adr + uVar9 * 4 + -0x40) + iVar10) - iVar5,
                   (*(int *)((long)ybf->store_buf_adr + uVar9 * 4 + -0x48) + iVar11) - iVar4,0,iVar5
                  );
    }
  }
  else {
    for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
      bVar13 = uVar12 != 0;
      uVar9 = (ulong)bVar13;
      bVar7 = 0;
      if (bVar13) {
        bVar7 = bVar2;
      }
      bVar6 = 0;
      if (bVar13) {
        bVar6 = bVar1;
      }
      iVar10 = iVar3 >> (bVar7 & 0x1f);
      iVar11 = iVar3 >> (bVar6 & 0x1f);
      iVar4 = *(int *)((long)ybf->store_buf_adr + uVar9 * 4 + -0x38);
      iVar5 = *(int *)((long)ybf->store_buf_adr + uVar9 * 4 + -0x30);
      extend_plane_high(ybf->store_buf_adr[uVar12 - 4],
                        *(int *)((long)ybf->store_buf_adr + uVar9 * 4 + -0x28),iVar4,iVar5,iVar10,
                        iVar11,(*(int *)((long)ybf->store_buf_adr + uVar9 * 4 + -0x40) + iVar10) -
                               iVar5,
                        (*(int *)((long)ybf->store_buf_adr + uVar9 * 4 + -0x48) + iVar11) - iVar4,0,
                        iVar5);
    }
  }
  return;
}

Assistant:

void aom_extend_frame_borders_c(YV12_BUFFER_CONFIG *ybf, const int num_planes) {
  extend_frame(ybf, ybf->border, num_planes);
}